

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfCreateBuffers(ErrorsTest *this)

{
  bool bVar1;
  uint in_EAX;
  int iVar2;
  undefined4 extraout_var;
  GLuint buffer;
  undefined8 uStack_28;
  long lVar3;
  
  uStack_28._0_4_ = in_EAX;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  uStack_28 = (ulong)(uint)uStack_28;
  (**(code **)(lVar3 + 0x3b8))(0xffffffff,(long)&uStack_28 + 4);
  bVar1 = ErrorCheckAndLog(this,"glCreateBuffers",0x501," if n is negative.");
  if (uStack_28._4_4_ != 0) {
    (**(code **)(lVar3 + 0x438))(1,(long)&uStack_28 + 4);
    do {
      iVar2 = (**(code **)(lVar3 + 0x800))();
    } while (iVar2 != 0);
  }
  return bVar1;
}

Assistant:

bool ErrorsTest::TestErrorsOfCreateBuffers()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok = true;

	/* Test. */
	glw::GLuint buffer = 0;

	gl.createBuffers(-1, &buffer);

	is_ok &= ErrorCheckAndLog("glCreateBuffers", GL_INVALID_VALUE, " if n is negative.");

	/* Sanity check. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		/* Possible error cleanup. */
		while (gl.getError())
			;
	}

	return is_ok;
}